

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter.hpp
# Opt level: O1

bool __thiscall
ylt::metric::basic_dynamic_counter<long,_(unsigned_char)'\x00'>::has_label_value
          (basic_dynamic_counter<long,_(unsigned_char)__x00_> *this,string *value)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::metric_pair>
  *e;
  pointer psVar2;
  vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::metric_pair>_>_>
  map;
  anon_class_1_0_00000001 local_39;
  vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::metric_pair>_>_>
  local_38;
  
  util::
  map_sharded_t<std::unordered_map<std::span<std::__cxx11::string_const,0ul>,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::value_type,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::my_hash<131ul>,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::my_equal,std::allocator<std::pair<std::span<std::__cxx11::string_const,0ul>const,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::value_type>>>,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::my_hash<137ul>>
  ::
  copy<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::metric_pair>,ylt::util::map_sharded_t<std::unordered_map<std::span<std::__cxx11::string_const,0ul>,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::value_type,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::my_hash<131ul>,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::my_equal,std::allocator<std::pair<std::span<std::__cxx11::string_const,0ul>const,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::value_type>>>,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::my_hash<137ul>>::copy<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::metric_pair>>()const::_lambda(auto:1&)_1_>
            (&local_38,
             &(this->super_dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>).map_,
             &local_39);
  for (psVar2 = local_38.
                super__Vector_base<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::metric_pair>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar2 != local_38.
                super__Vector_base<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::metric_pair>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; psVar2 = psVar2 + 1) {
    pbVar1 = std::
             __find_if<std::__cxx11::string*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (0,0,value);
    if (pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) break;
  }
  std::
  vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x00'>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x00'>::metric_pair>_>_>
  ::~vector(&local_38);
  return psVar2 != local_38.
                   super__Vector_base<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::metric_pair>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool has_label_value(const std::string &value) override {
    auto map = Base::copy();
    for (auto &e : map) {
      auto &label_value = e->label;
      if (auto it = std::find(label_value.begin(), label_value.end(), value);
          it != label_value.end()) {
        return true;
      }
    }

    return false;
  }